

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem-test.cc
# Opt level: O0

void __thiscall ProblemTest_MaxLogicalCons_Test::TestBody(ProblemTest_MaxLogicalCons_Test *this)

{
  bool bVar1;
  BasicProblem<mp::BasicProblemParams<int>_> *this_00;
  AssertionFailure *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i;
  Problem p;
  AssertHelper *in_stack_fffffffffffffb70;
  type_conflict tVar2;
  BasicExprFactory<std::allocator<char>_> *in_stack_fffffffffffffb78;
  ExprBase in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  int in_stack_fffffffffffffb8c;
  ExprBase in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  Type in_stack_fffffffffffffb9c;
  AssertionResult *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  undefined7 in_stack_fffffffffffffbb0;
  undefined1 in_stack_fffffffffffffbb7;
  Message *in_stack_fffffffffffffbe8;
  AssertHelper *in_stack_fffffffffffffbf0;
  allocator<char> local_3e1;
  string local_3e0 [32];
  AssertionResult local_3c0 [2];
  int local_3a0;
  undefined4 local_39c;
  AssertionResult local_398 [2];
  BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48> local_378;
  int local_364;
  
  mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblem
            ((BasicProblem<mp::BasicProblemParams<int>_> *)in_stack_fffffffffffffb90.impl_);
  for (local_364 = 0; local_364 < 100; local_364 = local_364 + 1) {
    local_378.super_ExprBase.impl_ =
         (ExprBase)
         mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                   (in_stack_fffffffffffffb78,SUB81((ulong)in_stack_fffffffffffffb70 >> 0x38,0));
    mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
              ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
               (LogicalConstant)in_stack_fffffffffffffb80.impl_,
               (type_conflict)((ulong)in_stack_fffffffffffffb70 >> 0x20));
    mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
              ((BasicProblem<mp::BasicProblemParams<int>_> *)
               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
               (LogicalExpr)in_stack_fffffffffffffb90.impl_);
  }
  local_39c = 100;
  local_3a0 = mp::BasicProblem<mp::BasicProblemParams<int>_>::num_logical_cons
                        ((BasicProblem<mp::BasicProblemParams<int>_> *)0x127641);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
             (char *)in_stack_fffffffffffffb80.impl_,(int *)in_stack_fffffffffffffb78,
             (int *)in_stack_fffffffffffffb70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_398);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffba0);
    testing::AssertionResult::failure_message((AssertionResult *)0x1276cc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
               (char *)in_stack_fffffffffffffb90.impl_,in_stack_fffffffffffffb8c,
               (char *)in_stack_fffffffffffffb80.impl_);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb70);
    testing::Message::~Message((Message *)0x127729);
  }
  tVar2 = (type_conflict)((ulong)in_stack_fffffffffffffb70 >> 0x20);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127781);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3c0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffbb7,in_stack_fffffffffffffbb0),
               in_stack_fffffffffffffba8,(allocator<char> *)in_stack_fffffffffffffba0);
    std::allocator<char>::~allocator(&local_3e1);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant
                (in_stack_fffffffffffffb78,SUB41((uint)tVar2 >> 0x18,0));
      mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>::BasicExpr<mp::LogicalConstant>
                ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)in_stack_fffffffffffffb78,
                 (LogicalConstant)in_stack_fffffffffffffb80.impl_,tVar2);
      mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
                ((BasicProblem<mp::BasicProblemParams<int>_> *)
                 CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                 (LogicalExpr)in_stack_fffffffffffffb90.impl_);
    }
    testing::AssertionResult::operator<<
              (in_stack_fffffffffffffba0,
               (char (*) [123])CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    std::__cxx11::string::~string(local_3e0);
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffba0);
  this_00 = (BasicProblem<mp::BasicProblemParams<int>_> *)
            testing::AssertionResult::failure_message((AssertionResult *)0x127b27);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c,
             (char *)in_stack_fffffffffffffb90.impl_,in_stack_fffffffffffffb8c,
             (char *)in_stack_fffffffffffffb80.impl_);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  testing::Message::~Message((Message *)0x127b7b);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x127bcd);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::~BasicProblem(this_00);
  return;
}

Assistant:

TEST(ProblemTest, MaxLogicalCons) {
  Problem p;
  for (int i = 0; i < MP_MAX_PROBLEM_ITEMS; ++i)
    p.AddCon(p.MakeLogicalConstant(true));
  EXPECT_EQ(MP_MAX_PROBLEM_ITEMS, p.num_logical_cons());
  EXPECT_ASSERT(p.AddCon(p.MakeLogicalConstant(true)),
                "too many logical constraints");
}